

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test::
SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test
          (SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test *this)

{
  undefined8 *in_RDI;
  SimplexTest *unaff_retaddr;
  
  SimplexTest::SimplexTest(unaff_retaddr);
  *in_RDI = &PTR__SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test_0026c690;
  return;
}

Assistant:

TEST_F(SimplexTest, EqualityRowBoundedVarsOptimalSolution) {
  lp.add_column(ColType::Bounded, 0, 5, -1);
  lp.add_column(ColType::Bounded, 0, 5, 0);
  lp.add_row(RowType::Equality, 0, 0, {1, -1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-5.0, z);
  EXPECT_EQ(DVector({5.0, 5.0, 0.0}), x);
}